

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP4Reader::ProcessMetadataForNewSteps(BP4Reader *this,size_t newIdxSize)

{
  size_t sVar1;
  
  Engine::RemoveCreatedVars(&this->super_Engine);
  adios2::format::BP4Deserializer::ParseMetadataIndex
            (&this->m_BP4Deserializer,
             (BufferSTL *)
             ((this->m_BP4Deserializer)._vptr_BP4Deserializer[-3] + 0x40 +
             (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),this->m_MDFileAbsolutePos,
             (bool)(this->m_IdxHeaderParsed ^ 1),true);
  this->m_IdxHeaderParsed = true;
  sVar1 = adios2::format::BP4Deserializer::ParseMetadata
                    (&this->m_BP4Deserializer,
                     (BufferSTL *)
                     ((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x88 +
                     (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),&this->super_Engine,
                     false);
  this->m_MDFileProcessedSize = sVar1 + this->m_MDFileAbsolutePos;
  return;
}

Assistant:

void BP4Reader::ProcessMetadataForNewSteps(const size_t newIdxSize)
{
    /* Remove all variables we created in the last step */
    RemoveCreatedVars();

    /* Parse metadata index table (without header) */
    /* We need to skew the index table pointers with the
       size of the already-processed metadata because the memory buffer of
       new metadata starts from 0 */
    m_BP4Deserializer.ParseMetadataIndex(m_BP4Deserializer.m_MetadataIndex, m_MDFileAbsolutePos,
                                         !m_IdxHeaderParsed, true);
    m_IdxHeaderParsed = true;

    // fills IO with Variables and Attributes
    const size_t newProcessedMDSize =
        m_BP4Deserializer.ParseMetadata(m_BP4Deserializer.m_Metadata, *this, false);

    // remember current end position in metadata and index table for next round
    m_MDFileProcessedSize = m_MDFileAbsolutePos + newProcessedMDSize;
    // if (m_BP4Deserializer.m_RankMPI == 0)
    //{
    //    m_MDIndexFileAlreadyReadSize += newIdxSize;
    //}
}